

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

Result<void> * __thiscall
wallet::CWallet::RemoveTxs(CWallet *this,vector<uint256,_std::allocator<uint256>_> *txs_to_remove)

{
  long lVar1;
  uint256 hash_00;
  bool bVar2;
  reference puVar3;
  bilingual_str *in_RSI;
  ConstevalStringLiteral in_RDI;
  long in_FS_OFFSET;
  CTxIn *txin;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range2;
  _Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *it;
  vector<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_std::allocator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_>_>
  *__range1_1;
  uint256 *hash;
  vector<uint256,_std::allocator<uint256>_> *__range1;
  const_iterator __end2;
  const_iterator __begin2;
  iterator __end1_1;
  iterator __begin1_1;
  iterator it_wtx;
  iterator __end1;
  iterator __begin1;
  vector<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_std::allocator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_>_>
  erased_txs;
  WalletBatch batch;
  uint256 hash_1;
  bilingual_str str_err;
  bilingual_str *in_stack_fffffffffffffbf8;
  bilingual_str *in_stack_fffffffffffffc00;
  CWallet *in_stack_fffffffffffffc08;
  bilingual_str *in_stack_fffffffffffffc10;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> in_stack_fffffffffffffc18;
  CWallet *in_stack_fffffffffffffc28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  undefined8 in_stack_fffffffffffffc70;
  undefined8 in_stack_fffffffffffffc78;
  undefined8 in_stack_fffffffffffffc80;
  undefined8 in_stack_fffffffffffffc88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI.lit;
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00,
             (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
             (AnnotatedMixin<std::recursive_mutex> *)0x170b8cd);
  GetDatabase(in_stack_fffffffffffffc08);
  WalletBatch::WalletBatch
            ((WalletBatch *)in_stack_fffffffffffffc08,(WalletDatabase *)in_stack_fffffffffffffc00,
             SUB81((ulong)in_stack_fffffffffffffbf8 >> 0x38,0));
  bVar2 = WalletBatch::TxnBegin((WalletBatch *)in_stack_fffffffffffffbf8);
  if (bVar2) {
    std::
    vector<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_std::allocator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_>_>
    ::vector((vector<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_std::allocator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_>_>
              *)in_stack_fffffffffffffbf8);
    bilingual_str::bilingual_str(in_stack_fffffffffffffbf8);
    std::vector<uint256,_std::allocator<uint256>_>::begin
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffc00);
    std::vector<uint256,_std::allocator<uint256>_>::end
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffc00);
    while (bVar2 = __gnu_cxx::operator==<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                             ((__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                               *)in_stack_fffffffffffffc08,
                              (__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                               *)in_stack_fffffffffffffc00), ((bVar2 ^ 0xffU) & 1) != 0) {
      puVar3 = __gnu_cxx::
               __normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>::
               operator*((__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                          *)in_stack_fffffffffffffbf8);
      std::
      unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
      ::find((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
              *)in_stack_fffffffffffffc00,(key_type *)in_stack_fffffffffffffbf8);
      std::
      unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
      ::end((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
             *)in_stack_fffffffffffffc00);
      bVar2 = std::__detail::operator==
                        ((_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                         in_stack_fffffffffffffc08,
                         (_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                         in_stack_fffffffffffffc00);
      if (bVar2) {
        ::_(in_RDI);
        base_blob<256u>::GetHex_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffc10);
        tinyformat::format<std::__cxx11::string>(in_RSI,args);
        bilingual_str::operator=
                  ((bilingual_str *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
        bilingual_str::~bilingual_str(in_stack_fffffffffffffbf8);
        std::__cxx11::string::~string(&in_stack_fffffffffffffbf8->original);
        bilingual_str::~bilingual_str(in_stack_fffffffffffffbf8);
        break;
      }
      in_stack_fffffffffffffbf8 = *(bilingual_str **)(puVar3->super_base_blob<256U>).m_data._M_elems
      ;
      in_stack_fffffffffffffc00 =
           *(bilingual_str **)((puVar3->super_base_blob<256U>).m_data._M_elems + 8);
      in_stack_fffffffffffffc08 =
           *(CWallet **)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x10);
      in_stack_fffffffffffffc10 =
           *(bilingual_str **)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x18);
      hash_00.super_base_blob<256U>.m_data._M_elems[8] = (char)in_stack_fffffffffffffc78;
      hash_00.super_base_blob<256U>.m_data._M_elems[9] =
           (char)((ulong)in_stack_fffffffffffffc78 >> 8);
      hash_00.super_base_blob<256U>.m_data._M_elems[10] =
           (char)((ulong)in_stack_fffffffffffffc78 >> 0x10);
      hash_00.super_base_blob<256U>.m_data._M_elems[0xb] =
           (char)((ulong)in_stack_fffffffffffffc78 >> 0x18);
      hash_00.super_base_blob<256U>.m_data._M_elems[0xc] =
           (char)((ulong)in_stack_fffffffffffffc78 >> 0x20);
      hash_00.super_base_blob<256U>.m_data._M_elems[0xd] =
           (char)((ulong)in_stack_fffffffffffffc78 >> 0x28);
      hash_00.super_base_blob<256U>.m_data._M_elems[0xe] =
           (char)((ulong)in_stack_fffffffffffffc78 >> 0x30);
      hash_00.super_base_blob<256U>.m_data._M_elems[0xf] =
           (char)((ulong)in_stack_fffffffffffffc78 >> 0x38);
      hash_00.super_base_blob<256U>.m_data._M_elems[0] = (char)in_stack_fffffffffffffc70;
      hash_00.super_base_blob<256U>.m_data._M_elems[1] =
           (char)((ulong)in_stack_fffffffffffffc70 >> 8);
      hash_00.super_base_blob<256U>.m_data._M_elems[2] =
           (char)((ulong)in_stack_fffffffffffffc70 >> 0x10);
      hash_00.super_base_blob<256U>.m_data._M_elems[3] =
           (char)((ulong)in_stack_fffffffffffffc70 >> 0x18);
      hash_00.super_base_blob<256U>.m_data._M_elems[4] =
           (char)((ulong)in_stack_fffffffffffffc70 >> 0x20);
      hash_00.super_base_blob<256U>.m_data._M_elems[5] =
           (char)((ulong)in_stack_fffffffffffffc70 >> 0x28);
      hash_00.super_base_blob<256U>.m_data._M_elems[6] =
           (char)((ulong)in_stack_fffffffffffffc70 >> 0x30);
      hash_00.super_base_blob<256U>.m_data._M_elems[7] =
           (char)((ulong)in_stack_fffffffffffffc70 >> 0x38);
      hash_00.super_base_blob<256U>.m_data._M_elems[0x10] = (char)in_stack_fffffffffffffc80;
      hash_00.super_base_blob<256U>.m_data._M_elems[0x11] =
           (char)((ulong)in_stack_fffffffffffffc80 >> 8);
      hash_00.super_base_blob<256U>.m_data._M_elems[0x12] =
           (char)((ulong)in_stack_fffffffffffffc80 >> 0x10);
      hash_00.super_base_blob<256U>.m_data._M_elems[0x13] =
           (char)((ulong)in_stack_fffffffffffffc80 >> 0x18);
      hash_00.super_base_blob<256U>.m_data._M_elems[0x14] =
           (char)((ulong)in_stack_fffffffffffffc80 >> 0x20);
      hash_00.super_base_blob<256U>.m_data._M_elems[0x15] =
           (char)((ulong)in_stack_fffffffffffffc80 >> 0x28);
      hash_00.super_base_blob<256U>.m_data._M_elems[0x16] =
           (char)((ulong)in_stack_fffffffffffffc80 >> 0x30);
      hash_00.super_base_blob<256U>.m_data._M_elems[0x17] =
           (char)((ulong)in_stack_fffffffffffffc80 >> 0x38);
      hash_00.super_base_blob<256U>.m_data._M_elems[0x18] = (char)in_stack_fffffffffffffc88;
      hash_00.super_base_blob<256U>.m_data._M_elems[0x19] =
           (char)((ulong)in_stack_fffffffffffffc88 >> 8);
      hash_00.super_base_blob<256U>.m_data._M_elems[0x1a] =
           (char)((ulong)in_stack_fffffffffffffc88 >> 0x10);
      hash_00.super_base_blob<256U>.m_data._M_elems[0x1b] =
           (char)((ulong)in_stack_fffffffffffffc88 >> 0x18);
      hash_00.super_base_blob<256U>.m_data._M_elems[0x1c] =
           (char)((ulong)in_stack_fffffffffffffc88 >> 0x20);
      hash_00.super_base_blob<256U>.m_data._M_elems[0x1d] =
           (char)((ulong)in_stack_fffffffffffffc88 >> 0x28);
      hash_00.super_base_blob<256U>.m_data._M_elems[0x1e] =
           (char)((ulong)in_stack_fffffffffffffc88 >> 0x30);
      hash_00.super_base_blob<256U>.m_data._M_elems[0x1f] =
           (char)((ulong)in_stack_fffffffffffffc88 >> 0x38);
      bVar2 = WalletBatch::EraseTx((WalletBatch *)in_stack_fffffffffffffc18._M_cur,hash_00);
      if (!bVar2) {
        ::_(in_RDI);
        base_blob<256u>::GetHex_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffc10);
        tinyformat::format<std::__cxx11::string>(in_RSI,args);
        bilingual_str::operator=
                  ((bilingual_str *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
        bilingual_str::~bilingual_str(in_stack_fffffffffffffbf8);
        std::__cxx11::string::~string(&in_stack_fffffffffffffbf8->original);
        bilingual_str::~bilingual_str(in_stack_fffffffffffffbf8);
        break;
      }
      std::
      vector<std::__detail::_Node_const_iterator<std::pair<uint256_const,wallet::CWalletTx>,false,true>,std::allocator<std::__detail::_Node_const_iterator<std::pair<uint256_const,wallet::CWalletTx>,false,true>>>
      ::
      emplace_back<std::__detail::_Node_iterator<std::pair<uint256_const,wallet::CWalletTx>,false,true>&>
                ((vector<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_std::allocator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_>_>
                  *)in_stack_fffffffffffffc18._M_cur,
                 (_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
                 in_stack_fffffffffffffc10);
      __gnu_cxx::__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>::
      operator++((__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_> *)
                 in_stack_fffffffffffffbf8);
    }
    bVar2 = bilingual_str::empty(in_stack_fffffffffffffbf8);
    if (bVar2) {
      bVar2 = WalletBatch::TxnCommit((WalletBatch *)in_stack_fffffffffffffbf8);
      if (bVar2) {
        std::
        vector<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_std::allocator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_>_>
        ::begin((vector<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_std::allocator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_>_>
                 *)in_stack_fffffffffffffc00);
        std::
        vector<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_std::allocator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_>_>
        ::end((vector<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_std::allocator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_>_>
               *)in_stack_fffffffffffffc00);
        while (bVar2 = __gnu_cxx::
                       operator==<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_*,_std::vector<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_std::allocator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_>_>_>
                                 ((__normal_iterator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_*,_std::vector<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_std::allocator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_>_>_>
                                   *)in_stack_fffffffffffffc08,
                                  (__normal_iterator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_*,_std::vector<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_std::allocator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_>_>_>
                                   *)in_stack_fffffffffffffc00), ((bVar2 ^ 0xffU) & 1) != 0) {
          __gnu_cxx::
          __normal_iterator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_*,_std::vector<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_std::allocator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_>_>_>
          ::operator*((__normal_iterator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_*,_std::vector<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_std::allocator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_>_>_>
                       *)in_stack_fffffffffffffbf8);
          std::__detail::
          _Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::operator->
                    ((_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>
                      *)in_stack_fffffffffffffbf8);
          in_stack_fffffffffffffc28 = (CWallet *)&in_RSI[10].original.field_2;
          std::__detail::
          _Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::operator->
                    ((_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>
                      *)in_stack_fffffffffffffbf8);
          std::
          multimap<long,_wallet::CWalletTx_*,_std::less<long>,_std::allocator<std::pair<const_long,_wallet::CWalletTx_*>_>_>
          ::erase((multimap<long,_wallet::CWalletTx_*,_std::less<long>,_std::allocator<std::pair<const_long,_wallet::CWalletTx_*>_>_>
                   *)in_stack_fffffffffffffc00,(const_iterator)in_stack_fffffffffffffc18._M_cur);
          std::__detail::
          _Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::operator->
                    ((_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>
                      *)in_stack_fffffffffffffbf8);
          std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_stack_fffffffffffffbf8);
          std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffc00);
          std::vector<CTxIn,_std::allocator<CTxIn>_>::end
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffc00);
          while (bVar2 = __gnu_cxx::
                         operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                   ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                     *)in_stack_fffffffffffffc08,
                                    (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                     *)in_stack_fffffffffffffc00), ((bVar2 ^ 0xffU) & 1) != 0) {
            __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
            ::operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                         *)in_stack_fffffffffffffbf8);
            std::
            unordered_multimap<COutPoint,_uint256,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<std::pair<const_COutPoint,_uint256>_>_>
            ::erase((unordered_multimap<COutPoint,_uint256,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<std::pair<const_COutPoint,_uint256>_>_>
                     *)in_stack_fffffffffffffc08,(key_type *)in_stack_fffffffffffffc00);
            __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
            ::operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                          *)in_stack_fffffffffffffbf8);
          }
          std::
          unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
          ::erase((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
                   *)in_stack_fffffffffffffc00,(const_iterator)in_stack_fffffffffffffc18._M_cur);
          boost::signals2::
          signal<void_(const_uint256_&,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_uint256_&,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_uint256_&,_ChangeType)>,_boost::signals2::mutex>
          ::operator()((signal<void_(const_uint256_&,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_uint256_&,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_uint256_&,_ChangeType)>,_boost::signals2::mutex>
                        *)in_stack_fffffffffffffc08,(uint256 *)in_stack_fffffffffffffc00,
                       (ChangeType)((ulong)in_stack_fffffffffffffbf8 >> 0x20));
          __gnu_cxx::
          __normal_iterator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_*,_std::vector<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_std::allocator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_>_>_>
          ::operator++((__normal_iterator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_*,_std::vector<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_std::allocator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_>_>_>
                        *)in_stack_fffffffffffffbf8);
        }
        MarkDirty(in_stack_fffffffffffffc28);
        util::Result<void>::Result((Result<void> *)in_stack_fffffffffffffc00);
      }
      else {
        ::_(in_RDI);
        util::Result<void>::Result
                  ((Result<void> *)in_stack_fffffffffffffc08,(Error *)in_stack_fffffffffffffc00);
        util::Error::~Error((Error *)in_stack_fffffffffffffbf8);
      }
    }
    else {
      WalletBatch::TxnAbort((WalletBatch *)in_stack_fffffffffffffbf8);
      bilingual_str::bilingual_str
                ((bilingual_str *)in_stack_fffffffffffffc18._M_cur,in_stack_fffffffffffffc10);
      util::Result<void>::Result
                ((Result<void> *)in_stack_fffffffffffffc08,(Error *)in_stack_fffffffffffffc00);
      util::Error::~Error((Error *)in_stack_fffffffffffffbf8);
    }
    bilingual_str::~bilingual_str(in_stack_fffffffffffffbf8);
    std::
    vector<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_std::allocator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_>_>
    ::~vector((vector<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_std::allocator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_>_>
               *)in_stack_fffffffffffffc08);
  }
  else {
    ::_(in_RDI);
    util::Result<void>::Result
              ((Result<void> *)in_stack_fffffffffffffc08,(Error *)in_stack_fffffffffffffc00);
    util::Error::~Error((Error *)in_stack_fffffffffffffbf8);
  }
  WalletBatch::~WalletBatch((WalletBatch *)in_stack_fffffffffffffbf8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (Result<void> *)args;
}

Assistant:

util::Result<void> CWallet::RemoveTxs(std::vector<uint256>& txs_to_remove)
{
    AssertLockHeld(cs_wallet);
    WalletBatch batch(GetDatabase());
    if (!batch.TxnBegin()) return util::Error{_("Error starting db txn for wallet transactions removal")};

    // Check for transaction existence and remove entries from disk
    using TxIterator = std::unordered_map<uint256, CWalletTx, SaltedTxidHasher>::const_iterator;
    std::vector<TxIterator> erased_txs;
    bilingual_str str_err;
    for (const uint256& hash : txs_to_remove) {
        auto it_wtx = mapWallet.find(hash);
        if (it_wtx == mapWallet.end()) {
            str_err = strprintf(_("Transaction %s does not belong to this wallet"), hash.GetHex());
            break;
        }
        if (!batch.EraseTx(hash)) {
            str_err = strprintf(_("Failure removing transaction: %s"), hash.GetHex());
            break;
        }
        erased_txs.emplace_back(it_wtx);
    }

    // Roll back removals in case of an error
    if (!str_err.empty()) {
        batch.TxnAbort();
        return util::Error{str_err};
    }

    // Dump changes to disk
    if (!batch.TxnCommit()) return util::Error{_("Error committing db txn for wallet transactions removal")};

    // Update the in-memory state and notify upper layers about the removals
    for (const auto& it : erased_txs) {
        const uint256 hash{it->first};
        wtxOrdered.erase(it->second.m_it_wtxOrdered);
        for (const auto& txin : it->second.tx->vin)
            mapTxSpends.erase(txin.prevout);
        mapWallet.erase(it);
        NotifyTransactionChanged(hash, CT_DELETED);
    }

    MarkDirty();

    return {}; // all good
}